

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O0

void rw::d3d9::freeInstanceData(Geometry *geometry)

{
  InstanceDataHeader *pIVar1;
  InstanceDataHeader *header;
  Geometry *geometry_local;
  
  if ((geometry->instData != (InstanceDataHeader *)0x0) && (geometry->instData->platform == 9)) {
    pIVar1 = geometry->instData;
    geometry->instData = (InstanceDataHeader *)0x0;
    destroyVertexDeclaration(*(void **)(pIVar1 + 0x16));
    d3d::destroyIndexBuffer(*(void **)(pIVar1 + 4));
    d3d::destroyVertexBuffer(*(void **)(pIVar1 + 8));
    d3d::destroyVertexBuffer(*(void **)(pIVar1 + 0xe));
    (*DAT_001685f8)(*(undefined8 *)(pIVar1 + 0x1a));
    (*DAT_001685f8)(pIVar1);
  }
  return;
}

Assistant:

void
freeInstanceData(Geometry *geometry)
{
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_D3D9)
		return;
	InstanceDataHeader *header =
		(InstanceDataHeader*)geometry->instData;
	geometry->instData = nil;
	destroyVertexDeclaration(header->vertexDeclaration);
	destroyIndexBuffer(header->indexBuffer);
	destroyVertexBuffer(header->vertexStream[0].vertexBuffer);
	destroyVertexBuffer(header->vertexStream[1].vertexBuffer);
	rwFree(header->inst);
	rwFree(header);
	return;
}